

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_switch_deviation(lys_deviation *dev,lys_module *module)

{
  uint16_t *puVar1;
  int iVar2;
  char *pcVar3;
  LY_ERR *pLVar4;
  char *pcVar5;
  undefined8 uVar6;
  lys_node *plVar7;
  lys_module *module_00;
  lys_node *parent;
  lys_node *local_38;
  lys_node *target;
  
  local_38 = (lys_node *)0x0;
  if (dev->deviate == (lys_deviate *)0x0) {
    return;
  }
  if (dev->deviate->mod != LY_DEVIATE_NO) {
    iVar2 = resolve_augment_schema_nodeid(dev->target_name,(lys_node *)0x0,module,1,&local_38);
    if (iVar2 != 0 || local_38 == (lys_node *)0x0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      uVar6 = 0x1045;
LAB_0015450c:
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
             ,uVar6);
      return;
    }
    lys_node_switch(local_38,dev->orig_node);
LAB_00154473:
    dev->orig_node = local_38;
    return;
  }
  pcVar5 = dev->target_name;
  plVar7 = dev->orig_node;
  if (plVar7 == (lys_node *)0x0) {
    iVar2 = resolve_augment_schema_nodeid(pcVar5,(lys_node *)0x0,module,1,&local_38);
    if (iVar2 != 0 || local_38 == (lys_node *)0x0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      uVar6 = 0x1032;
      goto LAB_0015450c;
    }
    plVar7 = local_38->parent;
    lys_node_unlink(local_38);
    if ((plVar7 != (lys_node *)0x0) && (plVar7->nodetype == LYS_AUGMENT)) {
      local_38->parent = plVar7;
    }
    goto LAB_00154473;
  }
  pcVar3 = strrchr(pcVar5,0x2f);
  if ((long)pcVar3 - (long)pcVar5 == 0) {
    module_00 = plVar7->module;
    parent = (lys_node *)0x0;
  }
  else {
    if (plVar7->parent != (lys_node *)0x0) {
      lys_node_addchild(plVar7->parent,(lys_module *)0x0,plVar7);
      puVar1 = &dev->orig_node->flags;
      *puVar1 = *puVar1 | 1;
      goto LAB_0015462b;
    }
    pcVar5 = strndup(pcVar5,(long)pcVar3 - (long)pcVar5);
    iVar2 = resolve_augment_schema_nodeid(pcVar5,(lys_node *)0x0,module,1,&local_38);
    free(pcVar5);
    if (iVar2 != 0 || local_38 == (lys_node *)0x0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      uVar6 = 0x1022;
      goto LAB_0015450c;
    }
    plVar7 = dev->orig_node;
    module_00 = (lys_module *)0x0;
    parent = local_38;
  }
  lys_node_addchild(parent,module_00,plVar7);
LAB_0015462b:
  dev->orig_node = (lys_node *)0x0;
  return;
}

Assistant:

static void
lys_switch_deviation(struct lys_deviation *dev, const struct lys_module *module)
{
    int ret;
    char *parent_path;
    struct lys_node *target = NULL, *parent;

    if (!dev->deviate) {
        return ;
    }

    if (dev->deviate[0].mod == LY_DEVIATE_NO) {
        if (dev->orig_node) {
            /* removing not-supported deviation ... */
            if (strrchr(dev->target_name, '/') != dev->target_name) {
                /* ... from a parent */

                /* reconnect to its previous position */
                parent = dev->orig_node->parent;
                if (parent) {
                    /* the original node was actually from augment, we have to get know if the augment is
                     * applied (its module is enabled and implemented). If yes, the node will be connected
                     * to the augment and the linkage with the target will be fixed if needed, otherwise
                     * it will be connected only to the augment */
                    /* first, connect it into the augment */
                    lys_node_addchild(parent, NULL, dev->orig_node);
                    if (!parent->module->disabled && parent->module->implemented) {
                        /* augment is supposed to be applied, so fix pointers in target and the status of the original node */
                        if (parent->child == dev->orig_node) {
                            /* the only node in augment */
                            dev->orig_node->flags |= LYS_NOTAPPLIED;
                            apply_aug((struct lys_node_augment *)parent);
                        } else {
                            /* other nodes from augment applied, nothing more needed in target, everything was done
                             * by lys_node_addchild() */
                            dev->orig_node->flags |= parent->child->flags & LYS_NOTAPPLIED;
                        }
                    } else {
                        /* augment is not supposed to be applied */
                        dev->orig_node->flags |= LYS_NOTAPPLIED;
                    }
                } else {
                    /* non-augment, non-toplevel */
                    parent_path = strndup(dev->target_name, strrchr(dev->target_name, '/') - dev->target_name);
                    ret = resolve_augment_schema_nodeid(parent_path, NULL, module, 1,
                                                        (const struct lys_node **)&target);
                    free(parent_path);
                    if (ret || !target) {
                        LOGINT;
                        return;
                    }
                    lys_node_addchild(target, NULL, dev->orig_node);
                }
            } else {
                /* ... from top-level data */
                lys_node_addchild(NULL, (struct lys_module *)dev->orig_node->module, dev->orig_node);
            }

            dev->orig_node = NULL;
        } else {
            /* adding not-supported deviation */
            ret = resolve_augment_schema_nodeid(dev->target_name, NULL, module, 1,
                                                (const struct lys_node **)&target);
            if (ret || !target) {
                LOGINT;
                return;
            }

            /* unlink and store the original node */
            parent = target->parent;
            lys_node_unlink(target);
            if (parent && parent->nodetype == LYS_AUGMENT) {
                /* hack for augment, because when the original will be sometime reconnected back, we actually need
                 * to reconnect it to both - the augment and its target (which is deduced from the deviations target
                 * path), so we need to remember the augment as an addition */
                target->parent = parent;
            }
            dev->orig_node = target;
        }
    } else {
        ret = resolve_augment_schema_nodeid(dev->target_name, NULL, module, 1,
                                            (const struct lys_node **)&target);
        if (ret || !target) {
            LOGINT;
            return;
        }

        lys_node_switch(target, dev->orig_node);
        dev->orig_node = target;
    }
}